

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O2

int lws_wsi_mux_action_pending_writeable_reqs(lws *wsi)

{
  lws *plVar1;
  int iVar2;
  lws **pplVar3;
  int _and;
  
  pplVar3 = &(wsi->mux).child_list;
  do {
    plVar1 = *pplVar3;
    if (plVar1 == (lws *)0x0) {
      _and = 4;
      iVar2 = 0;
      goto LAB_0011772e;
    }
    pplVar3 = &(plVar1->mux).sibling_list;
  } while ((plVar1->mux).requested_POLLOUT == '\0');
  iVar2 = 4;
  _and = 0;
LAB_0011772e:
  iVar2 = lws_change_pollfd(wsi,_and,iVar2);
  return -(uint)(iVar2 != 0);
}

Assistant:

int
lws_wsi_mux_action_pending_writeable_reqs(struct lws *wsi)
{
	struct lws *w = wsi->mux.child_list;

	while (w) {
		if (w->mux.requested_POLLOUT) {
			if (lws_change_pollfd(wsi, 0, LWS_POLLOUT))
				return -1;
			return 0;
		}
		w = w->mux.sibling_list;
	}

	if (lws_change_pollfd(wsi, LWS_POLLOUT, 0))
		return -1;

	return 0;
}